

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

void gflags::anon_unknown_2::RetrieveUnusedFlags
               (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                *matching_flags,NotableFlags *notable_flags,
               set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
               *unused_flags)

{
  const_iterator this;
  bool bVar1;
  reference ppCVar2;
  size_type sVar3;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  *unused_flags_local;
  NotableFlags *notable_flags_local;
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  *matching_flags_local;
  
  it._M_node = (_Base_ptr)unused_flags;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
       ::begin(matching_flags);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
         ::end(matching_flags);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppCVar2 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                        (&local_28);
    sVar3 = std::
            set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
            ::count(&notable_flags->perfect_match_flag,ppCVar2);
    if (sVar3 == 0) {
      ppCVar2 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                          (&local_28);
      sVar3 = std::
              set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
              ::count(&notable_flags->module_flags,ppCVar2);
      if (sVar3 == 0) {
        ppCVar2 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                            (&local_28);
        sVar3 = std::
                set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                ::count(&notable_flags->package_flags,ppCVar2);
        if (sVar3 == 0) {
          ppCVar2 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                              (&local_28);
          sVar3 = std::
                  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                  ::count(&notable_flags->most_common_flags,ppCVar2);
          if (sVar3 == 0) {
            ppCVar2 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                                (&local_28);
            sVar3 = std::
                    set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                    ::count(&notable_flags->subpackage_flags,ppCVar2);
            this = it;
            if (sVar3 == 0) {
              ppCVar2 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                                  (&local_28);
              std::
              set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
              ::insert((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                        *)this._M_node,ppCVar2);
            }
          }
        }
      }
    }
    std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator++(&local_28);
  }
  return;
}

Assistant:

static void RetrieveUnusedFlags(
    const set<const CommandLineFlagInfo *> &matching_flags,
    const NotableFlags &notable_flags,
    set<const CommandLineFlagInfo *> *unused_flags) {
  // Remove from 'matching_flags' set all members of the sets of
  // flags we've already printed (specifically, those in notable_flags)
  for (set<const CommandLineFlagInfo *>::const_iterator it =
        matching_flags.begin();
      it != matching_flags.end();
      ++it) {
    if (notable_flags.perfect_match_flag.count(*it) ||
        notable_flags.module_flags.count(*it) ||
        notable_flags.package_flags.count(*it) ||
        notable_flags.most_common_flags.count(*it) ||
        notable_flags.subpackage_flags.count(*it))
      continue;
    unused_flags->insert(*it);
  }
}